

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

double b2d(Bigint *a,int *e)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  ULong x;
  uint uVar5;
  ULong UVar6;
  ULong *pUVar7;
  
  iVar1 = a->wds;
  pUVar7 = a->x + (long)iVar1 + -1;
  x = *pUVar7;
  uVar3 = hi0bits(x);
  *e = 0x20 - uVar3;
  cVar2 = (char)uVar3;
  if (uVar3 < 0xb) {
    uVar3 = 0;
    if (a->x < pUVar7) {
      uVar3 = a->x[(long)iVar1 + -2];
    }
    uVar5 = uVar3 >> (0xbU - cVar2 & 0x1f) | x << (cVar2 + 0x15U & 0x1f);
    x = x >> (0xbU - cVar2 & 0x1f);
  }
  else {
    uVar5 = 0;
    if (1 < iVar1) {
      uVar5 = a->x[(long)iVar1 + -2];
      pUVar7 = a->x + (long)iVar1 + -2;
    }
    if (uVar3 - 0xb != 0) {
      bVar4 = (byte)(uVar3 - 0xb);
      UVar6 = 0;
      if (a->x < pUVar7) {
        UVar6 = pUVar7[-1];
      }
      x = x << (bVar4 & 0x1f) | uVar5 >> (0x2bU - cVar2 & 0x1f);
      uVar5 = uVar5 << (bVar4 & 0x1f) | UVar6 >> (0x2bU - cVar2 & 0x1f);
    }
  }
  return (double)(CONCAT44(x,uVar5) | 0x3ff0000000000000);
}

Assistant:

static double
b2d(Bigint *a, int *e)
{
	ULong *xa, *xa0, w, y, z;
	int k;
	U d;
#ifdef VAX
	ULong d0, d1;
#else
#define d0 word0(&d)
#define d1 word1(&d)
#endif

	xa0 = a->x;
	xa = xa0 + a->wds;
	y = *--xa;
#ifdef DEBUG
	if (!y) Bug("zero y in b2d");
#endif
	k = hi0bits(y);
	*e = 32 - k;
#ifdef Pack_32
	if (k < Ebits) {
		d0 = Exp_1 | y >> (Ebits - k);
		w = xa > xa0 ? *--xa : 0;
		d1 = y << ((32-Ebits) + k) | w >> (Ebits - k);
		goto ret_d;
		}
	z = xa > xa0 ? *--xa : 0;
	if (k -= Ebits) {
		d0 = Exp_1 | y << k | z >> (32 - k);
		y = xa > xa0 ? *--xa : 0;
		d1 = z << k | y >> (32 - k);
		}
	else {
		d0 = Exp_1 | y;
		d1 = z;
		}
#else
	if (k < Ebits + 16) {
		z = xa > xa0 ? *--xa : 0;
		d0 = Exp_1 | y << k - Ebits | z >> Ebits + 16 - k;
		w = xa > xa0 ? *--xa : 0;
		y = xa > xa0 ? *--xa : 0;
		d1 = z << k + 16 - Ebits | w << k - Ebits | y >> 16 + Ebits - k;
		goto ret_d;
		}
	z = xa > xa0 ? *--xa : 0;
	w = xa > xa0 ? *--xa : 0;
	k -= Ebits + 16;
	d0 = Exp_1 | y << k + 16 | z << k | w >> 16 - k;
	y = xa > xa0 ? *--xa : 0;
	d1 = w << k + 16 | y << k;
#endif
 ret_d:
#ifdef VAX
	word0(&d) = d0 >> 16 | d0 << 16;
	word1(&d) = d1 >> 16 | d1 << 16;
#else
#undef d0
#undef d1
#endif
	return dval(&d);
	}